

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,char bits)

{
  byte in_SIL;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  
  if ((char)in_SIL < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<short>::operator>>=(U) [T = short, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
                 );
  }
  if ((char)in_SIL < '\x10') {
    in_RDI->m_int = (short)((int)in_RDI->m_int >> (in_SIL & 0x1f));
    return in_RDI;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<short>::operator>>=(U) [T = short, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }